

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_expectNoCallInScopeThatHappened_Test::testBody
          (TEST_MockCallTest_expectNoCallInScopeThatHappened_Test *this)

{
  UtestShell *test;
  MockSupport *pMVar1;
  SimpleString local_100;
  SimpleString local_f0;
  SimpleString local_e0;
  SimpleString local_d0;
  SimpleString local_c0;
  undefined1 local_b0 [8];
  MockUnexpectedCallHappenedFailure expectedFailure;
  undefined1 local_28 [8];
  MockExpectedCallsListForTest expectations;
  MockFailureReporterInstaller failureReporterInstaller;
  TEST_MockCallTest_expectNoCallInScopeThatHappened_Test *this_local;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)
             ((long)&expectations.super_MockExpectedCallsList.head_ + 7));
  MockExpectedCallsListForTest::MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_28);
  SimpleString::SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_,"scope::lazy"
            );
  MockExpectedCallsListForTest::addFunction
            ((MockExpectedCallsListForTest *)local_28,0,
             (SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  SimpleString::~SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_c0,"scope::lazy");
  MockUnexpectedCallHappenedFailure::MockUnexpectedCallHappenedFailure
            ((MockUnexpectedCallHappenedFailure *)local_b0,test,&local_c0,
             (MockExpectedCallsList *)local_28);
  SimpleString::~SimpleString(&local_c0);
  SimpleString::SimpleString(&local_d0,"scope");
  pMVar1 = mock(&local_d0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_e0,"lazy");
  (*pMVar1->_vptr_MockSupport[4])(pMVar1,&local_e0);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::SimpleString(&local_f0,"scope");
  pMVar1 = mock(&local_f0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_100,"lazy");
  (*pMVar1->_vptr_MockSupport[6])(pMVar1,&local_100);
  SimpleString::~SimpleString(&local_100);
  SimpleString::~SimpleString(&local_f0);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)local_b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x110);
  MockUnexpectedCallHappenedFailure::~MockUnexpectedCallHappenedFailure
            ((MockUnexpectedCallHappenedFailure *)local_b0);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_28);
  MockFailureReporterInstaller::~MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)
             ((long)&expectations.super_MockExpectedCallsList.head_ + 7));
  return;
}

Assistant:

TEST(MockCallTest, expectNoCallInScopeThatHappened)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction(0, "scope::lazy");
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "scope::lazy", expectations);

    mock("scope").expectNoCall("lazy");
    mock("scope").actualCall("lazy");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}